

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t *
gs_c_fn_print(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  gs_val_t val;
  gs_val_t *pgVar1;
  int local_20;
  int i;
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  pgVar1 = __return_storage_ptr__;
  for (local_20 = 0; local_20 < num_vals; local_20 = local_20 + 1) {
    val.field_2._8_8_ = pgVar1;
    val._0_16_ = vals[local_20].field_2;
    gs_c_fn_print_val(val);
  }
  printf("\n");
  gs_val_void();
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_print(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    GOLF_UNUSED(eval);

    for (int i = 0; i < num_vals; i++) {
        gs_c_fn_print_val(vals[i]);
    }
    printf("\n");
    return gs_val_void();
}